

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseSystemLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputState xVar2;
  xmlParserInputPtr pxVar3;
  uint uVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  long lVar8;
  int iVar9;
  xmlParserErrors error;
  int iVar10;
  int iVar11;
  int l;
  int local_38;
  uint local_34;
  
  xVar2 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar3 = ctxt->input;
    if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
       ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar1 = *ctxt->input->cur;
  uVar4 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      pxVar6 = (xmlChar *)0x0;
      error = XML_ERR_LITERAL_NOT_STARTED;
LAB_0015dc33:
      xmlFatalErr(ctxt,error,(char *)0x0);
      return pxVar6;
    }
    uVar4 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar6 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar6 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
  local_34 = uVar4;
  uVar4 = xmlCurrentChar(ctxt,&local_38);
  iVar11 = 100;
  iVar9 = 0;
  iVar10 = 0;
  do {
    if ((int)uVar4 < 0x100) {
      if (((int)uVar4 < 0x20) && ((0xd < uVar4 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)))) {
        pxVar6[iVar9] = '\0';
        ctxt->instate = xVar2;
LAB_0015dd3b:
        error = XML_ERR_LITERAL_NOT_FINISHED;
        goto LAB_0015dc33;
      }
      if (uVar4 == local_34) {
        pxVar6[iVar9] = '\0';
        ctxt->instate = xVar2;
LAB_0015dcad:
        xmlNextChar(ctxt);
        return pxVar6;
      }
    }
    else if ((uVar4 == local_34) ||
            ((uVar4 - 0xfffe < 0xffffe002 && uVar4 - 0x110000 < 0xfff00000) && 0xd7ff < uVar4)) {
      pxVar6[iVar9] = '\0';
      ctxt->instate = xVar2;
      if (uVar4 - 0x10000 < 0x100000 || (uVar4 - 0xe000 < 0x1ffe || uVar4 < 0xd800))
      goto LAB_0015dcad;
      goto LAB_0015dd3b;
    }
    pxVar7 = pxVar6;
    if (iVar11 <= iVar9 + 5) {
      if ((50000 < iVar11) && ((ctxt->options & 0x80000) == 0)) {
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"SystemLiteral");
        (*xmlFree)(pxVar6);
        ctxt->instate = xVar2;
        return (xmlChar *)0x0;
      }
      iVar11 = iVar11 * 2;
      pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar6,(long)iVar11);
      if (pxVar7 == (xmlChar *)0x0) {
        (*xmlFree)(pxVar6);
        xmlErrMemory(ctxt,(char *)0x0);
        ctxt->instate = xVar2;
        return (xmlChar *)0x0;
      }
    }
    if (iVar10 < 0x32) {
      iVar10 = iVar10 + 1;
    }
    else {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      iVar10 = 0;
      if (ctxt->instate == XML_PARSER_EOF) {
        (*xmlFree)(pxVar7);
        return (xmlChar *)0x0;
      }
    }
    if (local_38 == 1) {
      lVar8 = (long)iVar9;
      iVar9 = iVar9 + 1;
      pxVar7[lVar8] = (xmlChar)uVar4;
    }
    else {
      iVar5 = xmlCopyCharMultiByte(pxVar7 + iVar9,uVar4);
      iVar9 = iVar5 + iVar9;
    }
    pxVar3 = ctxt->input;
    if (*pxVar3->cur == '\n') {
      pxVar3->line = pxVar3->line + 1;
      pxVar3->col = 1;
    }
    else {
      pxVar3->col = pxVar3->col + 1;
    }
    pxVar3->cur = pxVar3->cur + local_38;
    uVar4 = xmlCurrentChar(ctxt,&local_38);
    pxVar6 = pxVar7;
    if (uVar4 == 0) {
      if ((ctxt->progressive == 0) &&
         ((0xf9 < (long)ctxt->input->end - (long)ctxt->input->cur ||
          (xmlGROW(ctxt), ctxt->progressive == 0)))) {
        pxVar3 = ctxt->input;
        if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
           ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
          xmlSHRINK(ctxt);
        }
      }
      uVar4 = xmlCurrentChar(ctxt,&local_38);
    }
  } while( true );
}

Assistant:

xmlChar *
xmlParseSystemLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int cur, l;
    xmlChar stop;
    int state = ctxt->instate;
    int count = 0;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }

    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
        xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_SYSTEM_LITERAL;
    cur = CUR_CHAR(l);
    while ((IS_CHAR(cur)) && (cur != stop)) { /* checked */
	if (len + 5 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "SystemLiteral");
                xmlFree(buf);
		ctxt->instate = (xmlParserInputState) state;
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = (xmlParserInputState) state;
		return(NULL);
	    }
	    buf = tmp;
	}
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
	        xmlFree(buf);
		return(NULL);
            }
	}
	COPY_BUF(l,buf,len,cur);
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    ctxt->instate = (xmlParserInputState) state;
    if (!IS_CHAR(cur)) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    return(buf);
}